

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_perform_rcpt_to(connectdata *conn)

{
  CURLcode CVar1;
  char *fmt;
  
  fmt = "RCPT TO:<%s>";
  if (*(char *)**(undefined8 **)((long)(conn->data->req).protop + 0x10) == '<') {
    fmt = "RCPT TO:%s";
  }
  CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,fmt);
  if (CVar1 == CURLE_OK) {
    (conn->proto).imapc.state = IMAP_FETCH;
  }
  return CVar1;
}

Assistant:

static CURLcode smtp_perform_rcpt_to(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct SMTP *smtp = data->req.protop;

  /* Send the RCPT TO command */
  if(smtp->rcpt->data[0] == '<')
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "RCPT TO:%s",
                            smtp->rcpt->data);
  else
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "RCPT TO:<%s>",
                            smtp->rcpt->data);
  if(!result)
    state(conn, SMTP_RCPT);

  return result;
}